

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionMeshCollection.cpp
# Opt level: O0

aphy_error __thiscall
APhyBullet::APhyBulletCollisionMeshCollection::addCollisionMeshAccessorWithTransform
          (APhyBulletCollisionMeshCollection *this,aphy_collision_mesh_accessor *accessor,
          btTransform *transform)

{
  btTriangleMesh *in_RDX;
  long *in_RSI;
  float *v3_1;
  float *v2_1;
  float *v1_1;
  uint32_t i3_1;
  uint32_t i2_1;
  uint32_t i1_1;
  size_t t_1;
  uint32_t *indices_1;
  float *v3;
  float *v2;
  float *v1;
  uint16_t i3;
  uint16_t i2;
  uint16_t i1;
  size_t t;
  uint16_t *indices;
  size_t triangleCount;
  uint8_t *rawVertices;
  uint8_t *rawIndices;
  btVector3 *in_stack_fffffffffffffe28;
  btTransform *in_stack_fffffffffffffe30;
  btTriangleMesh *this_00;
  btVector3 *in_stack_fffffffffffffe38;
  btVector3 *this_01;
  btVector3 *in_stack_fffffffffffffe40;
  btTriangleMesh *vertex1;
  btVector3 *in_stack_fffffffffffffe48;
  btVector3 *this_02;
  btTriangleMesh *in_stack_fffffffffffffe50;
  btTriangleMesh *this_03;
  btVector3 local_158;
  btScalar local_148 [4];
  btVector3 local_138;
  btScalar local_128 [4];
  btVector3 local_118;
  btScalar local_108 [4];
  btScalar *local_f8;
  btScalar *local_f0;
  btScalar *local_e8;
  int local_dc;
  int local_d8;
  int local_d4;
  ulong local_d0;
  int *local_c8;
  btVector3 local_c0;
  btScalar local_b0 [4];
  btVector3 local_a0;
  btScalar local_90 [4];
  btVector3 local_80;
  btScalar local_70 [4];
  btScalar *local_60;
  btScalar *local_58;
  btScalar *local_50;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  ulong local_40;
  ushort *local_38;
  ulong local_30;
  long local_28;
  long local_20;
  btTriangleMesh *local_18;
  long *local_10;
  
  local_20 = in_RSI[3];
  local_28 = *in_RSI;
  local_30 = (ulong)*(uint *)(in_RSI + 5) / 3;
  local_10 = in_RSI;
  if (*(int *)((long)in_RSI + 0x24) == 2) {
    local_38 = (ushort *)(local_20 + (ulong)*(uint *)(in_RSI + 4));
    for (local_40 = 0; local_40 < local_30; local_40 = local_40 + 1) {
      local_42 = *local_38;
      local_44 = local_38[1];
      local_46 = local_38[2];
      local_50 = (btScalar *)
                 (local_28 + (ulong)*(uint *)(local_10 + 1) +
                 (ulong)((uint)local_42 * *(int *)((long)local_10 + 0xc)));
      local_58 = (btScalar *)
                 (local_28 + (ulong)*(uint *)(local_10 + 1) +
                 (ulong)((uint)local_44 * *(int *)((long)local_10 + 0xc)));
      local_60 = (btScalar *)
                 (local_28 + (ulong)*(uint *)(local_10 + 1) +
                 (ulong)((uint)local_46 * *(int *)((long)local_10 + 0xc)));
      btVector3::btVector3(&local_80,local_50,local_50 + 1,local_50 + 2);
      local_70 = (btScalar  [4])
                 btTransform::operator*(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      btVector3::btVector3(&local_a0,local_58,local_58 + 1,local_58 + 2);
      local_90 = (btScalar  [4])
                 btTransform::operator*(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      btVector3::btVector3(&local_c0,local_60,local_60 + 1,local_60 + 2);
      local_b0 = (btScalar  [4])
                 btTransform::operator*(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      btTriangleMesh::addTriangle
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38,SUB81((ulong)in_stack_fffffffffffffe30 >> 0x38,0));
      local_38 = local_38 + 3;
    }
  }
  else if (*(int *)((long)in_RSI + 0x24) == 4) {
    local_c8 = (int *)(local_20 + (ulong)*(uint *)(in_RSI + 4));
    local_18 = in_RDX;
    for (local_d0 = 0; local_d0 < local_30; local_d0 = local_d0 + 1) {
      local_d4 = *local_c8;
      local_d8 = local_c8[1];
      local_dc = local_c8[2];
      local_e8 = (btScalar *)
                 (local_28 + (ulong)*(uint *)(local_10 + 1) +
                 (ulong)(uint)(local_d4 * *(int *)((long)local_10 + 0xc)));
      local_f0 = (btScalar *)
                 (local_28 + (ulong)*(uint *)(local_10 + 1) +
                 (ulong)(uint)(local_d8 * *(int *)((long)local_10 + 0xc)));
      local_f8 = (btScalar *)
                 (local_28 + (ulong)*(uint *)(local_10 + 1) +
                 (ulong)(uint)(local_dc * *(int *)((long)local_10 + 0xc)));
      this_01 = &local_118;
      this_00 = local_18;
      btVector3::btVector3(this_01,local_e8,local_e8 + 1,local_e8 + 2);
      local_108 = (btScalar  [4])
                  btTransform::operator*((btTransform *)this_00,in_stack_fffffffffffffe28);
      this_02 = &local_138;
      vertex1 = local_18;
      btVector3::btVector3(this_02,local_f0,local_f0 + 1,local_f0 + 2);
      local_128 = (btScalar  [4])
                  btTransform::operator*((btTransform *)this_00,in_stack_fffffffffffffe28);
      this_03 = local_18;
      btVector3::btVector3(&local_158,local_f8,local_f8 + 1,local_f8 + 2);
      local_148 = (btScalar  [4])
                  btTransform::operator*((btTransform *)this_00,in_stack_fffffffffffffe28);
      btTriangleMesh::addTriangle
                (this_03,this_02,(btVector3 *)vertex1,this_01,SUB81((ulong)this_00 >> 0x38,0));
      local_c8 = local_c8 + 3;
    }
  }
  return APHY_OK;
}

Assistant:

aphy_error APhyBulletCollisionMeshCollection::addCollisionMeshAccessorWithTransform(aphy_collision_mesh_accessor* accessor, const btTransform &transform)
{
    auto rawIndices = reinterpret_cast<const uint8_t*> (accessor->indices);
    auto rawVertices = reinterpret_cast<const uint8_t*> (accessor->vertices);
    size_t triangleCount = accessor->index_count / 3;
    if(accessor->index_stride == 2)
    {
        auto indices = reinterpret_cast<const uint16_t*> (rawIndices + accessor->index_offset);
        for(size_t t = 0; t < triangleCount; ++t, indices +=3)
        {
            auto i1 = indices[0];
            auto i2 = indices[1];
            auto i3 = indices[2];

            auto v1 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i1*accessor->vertex_stride);
            auto v2 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i2*accessor->vertex_stride);
            auto v3 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i3*accessor->vertex_stride);
            triangleMeshData.addTriangle(
                transform*btVector3(v1[0], v1[1], v1[2]),
                transform*btVector3(v2[0], v2[1], v2[2]),
                transform*btVector3(v3[0], v3[1], v3[2]));
        }

    }
    else if(accessor->index_stride == 4)
    {
        auto indices = reinterpret_cast<const uint32_t*> (rawIndices + accessor->index_offset);
        for(size_t t = 0; t < triangleCount; ++t, indices +=3)
        {
            auto i1 = indices[0];
            auto i2 = indices[1];
            auto i3 = indices[2];

            auto v1 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i1*accessor->vertex_stride);
            auto v2 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i2*accessor->vertex_stride);
            auto v3 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i3*accessor->vertex_stride);
            triangleMeshData.addTriangle(
                transform*btVector3(v1[0], v1[1], v1[2]),
                transform*btVector3(v2[0], v2[1], v2[2]),
                transform*btVector3(v3[0], v3[1], v3[2]));
        }
    }

    return APHY_OK;
}